

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::ScanLineInputFile::rawPixelDataToBuffer
          (ScanLineInputFile *this,int scanLine,char *pixelData,int *pixelDataSize)

{
  ArgExc *pAVar1;
  int in_ESI;
  long in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  Lock lock;
  int *in_stack_00000330;
  char **in_stack_00000338;
  int in_stack_00000344;
  Data *in_stack_00000348;
  InputStreamMutex *in_stack_00000350;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  Mutex *in_stack_fffffffffffffe08;
  Lock *in_stack_fffffffffffffe10;
  
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x144) & 1) != 0) {
    pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (pAVar1,
               "Reading raw pixel data to a buffer is not supported for memory mapped streams.");
    __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(bool)in_stack_fffffffffffffe07);
  if ((*(int *)(*(long *)(in_RDI + 8) + 0xa4) <= in_ESI) &&
     (in_ESI <= *(int *)(*(long *)(in_RDI + 8) + 0xa8))) {
    anon_unknown_6::readPixelData
              (in_stack_00000350,in_stack_00000348,in_stack_00000344,in_stack_00000338,
               in_stack_00000330);
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    return;
  }
  pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar1,"Tried to read scan line outside the image file\'s data window.");
  __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void ScanLineInputFile::rawPixelDataToBuffer(int scanLine,
                                             char *pixelData,
                                             int &pixelDataSize) const
{
  if (_data->memoryMapped) {
    throw IEX_NAMESPACE::ArgExc ("Reading raw pixel data to a buffer "
                                 "is not supported for memory mapped "
                                 "streams." );
  }

  try 
  {
    Lock lock (*_streamData);
    
    if (scanLine < _data->minY || scanLine > _data->maxY) 
    {
      throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
                                   "the image file's data window.");
    }
    
    readPixelData
      (_streamData, _data, scanLine, pixelData, pixelDataSize);
    
  }
  catch (IEX_NAMESPACE::BaseExc &e) 
  {
    REPLACE_EXC (e, "Error reading pixel data from image "
                 "file \"" << fileName() << "\". " << e.what());
    throw;
  }
}